

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

PSymbol * __thiscall PSymbolTable::AddSymbol(PSymbolTable *this,PSymbol *sym)

{
  IPair *pIVar1;
  Node *pNVar2;
  PSymbol *local_18;
  FName local_c;
  
  local_c.Index = *(int *)&(sym->super_PTypeBase).super_DObject.field_0x24;
  pNVar2 = (this->Symbols).Nodes + ((this->Symbols).Size - 1 & local_c.Index);
  while ((pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pIVar1 = &pNVar2->Pair;
    pNVar2 = pNVar2->Next;
    if ((pIVar1->Key).Index == local_c.Index) {
      return (PSymbol *)0x0;
    }
  }
  local_18 = sym;
  TMap<FName,_PSymbol_*,_THashTraits<FName>,_TValueTraits<PSymbol_*>_>::Insert
            (&this->Symbols,&local_c,&local_18);
  return local_18;
}

Assistant:

PSymbol *PSymbolTable::AddSymbol (PSymbol *sym)
{
	// Symbols that already exist are not inserted.
	if (Symbols.CheckKey(sym->SymbolName) != NULL)
	{
		return NULL;
	}
	Symbols.Insert(sym->SymbolName, sym);
	return sym;
}